

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock
          (ThreadSafeArena *this,void *buf,size_t size,AllocationPolicy *policy)

{
  ulong uVar1;
  undefined8 uVar2;
  size_t sVar3;
  bool bVar4;
  ArenaBlock *pAVar5;
  ArenaBlock *pAVar6;
  undefined8 *puVar7;
  size_t sVar8;
  long *plVar9;
  SizedPtr SVar10;
  LogMessageFatal aLStack_48 [16];
  ArenaBlock *pAStack_38;
  void *pvStack_30;
  long alStack_18 [2];
  
  SVar10.n = size;
  SVar10.p = buf;
  plVar9 = alStack_18;
  uVar1 = policy->start_block_size;
  if ((((uVar1 == 0x100) && (policy->max_block_size == 0x8000)) &&
      ((AllocationPolicy *)policy->block_alloc == (AllocationPolicy *)0x0)) &&
     (policy->block_dealloc == (_func_void_void_ptr_size_t *)0x0)) {
    pAVar5 = FirstBlock(this,buf,size);
    return pAVar5;
  }
  puVar7 = (undefined8 *)((ulong)buf & 7);
  if (puVar7 == (undefined8 *)0x0) {
    if (size < 0x30 || buf == (void *)0x0) {
      sVar8 = 0x30;
      if (0x30 < uVar1) {
        sVar8 = uVar1;
      }
      SVar10 = anon_unknown_12::AllocateMemory((AllocationPolicy *)policy->block_alloc,sVar8);
    }
    else {
      *(byte *)&(this->alloc_policy_).policy_ = (byte)(this->alloc_policy_).policy_ | 1;
    }
    ArenaBlock::ArenaBlock((ArenaBlock *)SVar10.p,(ArenaBlock *)0x0,SVar10.n);
    return (ArenaBlock *)SVar10.p;
  }
  FirstBlock();
  pvStack_30 = buf;
  pAVar6 = (ArenaBlock *)__tls_get_addr(&PTR_001b3f20);
  pAVar5 = pAVar6->next;
  if ((char)pAVar5 == '\0') {
    LOCK();
    UNLOCK();
    pAVar5 = (ArenaBlock *)(lifecycle_id_ << 8);
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  pAVar6->next = (ArenaBlock *)((long)&pAVar5->next + 1);
  *puVar7 = pAVar5;
  puVar7[4] = kSentryArenaChunk;
  puVar7[5] = pAVar6;
  pAVar6[1].next = (ArenaBlock *)(puVar7 + 6);
  pAVar6->size = (size_t)pAVar5;
  if (((*plVar9 == 0x100) && (plVar9[1] == 0x8000)) && ((plVar9[2] == 0 && (plVar9[3] == 0)))) {
    return pAVar6;
  }
  uVar1 = puVar7[1];
  bVar4 = SerialArena::MaybeAllocateAligned((SerialArena *)(puVar7 + 6),0x20,&pAStack_38);
  if (bVar4) {
    pAVar5 = (ArenaBlock *)*plVar9;
    sVar8 = plVar9[1];
    sVar3 = plVar9[3];
    pAStack_38[1].next = (ArenaBlock *)plVar9[2];
    pAStack_38[1].size = sVar3;
    pAStack_38->next = pAVar5;
    pAStack_38->size = sVar8;
    if (((ulong)pAStack_38 & 3) == 0) {
      uVar2 = puVar7[1];
      puVar7[1] = (ulong)((uint)uVar2 & 7) | (ulong)pAStack_38;
      if (uVar1 < 4) {
        return pAStack_38;
      }
      if (((uint)uVar1 & 3) == ((uint)uVar2 & 3)) {
        return pAStack_38;
      }
    }
    else {
      InitializeWithPolicy();
    }
    InitializeWithPolicy();
  }
  else {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/arena.cc"
               ,0x272);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)aLStack_48,(char (*) [39])"MaybeAllocateAligned cannot fail here.");
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_48);
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size,
                                        const AllocationPolicy& policy) {
  if (policy.IsDefault()) return FirstBlock(buf, size);

  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);

  SizedPtr mem;
  if (buf == nullptr || size < kBlockHeaderSize + kAllocPolicySize) {
    mem = AllocateBlock(&policy, 0, kAllocPolicySize);
  } else {
    mem = {buf, size};
    // Record user-owned block.
    alloc_policy_.set_is_user_owned_initial_block(true);
  }

  return new (mem.p) ArenaBlock{nullptr, mem.n};
}